

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitVAArgumentExpression(SyntaxDumper *this,VAArgumentExpressionSyntax *node)

{
  SyntaxToken local_50;
  
  VAArgumentExpressionSyntax::keyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  VAArgumentExpressionSyntax::openParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr_);
  VAArgumentExpressionSyntax::commaToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->typeName_);
  VAArgumentExpressionSyntax::closeParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitVAArgumentExpression(const VAArgumentExpressionSyntax* node) override
    {
        terminal(node->keyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->expression());
        terminal(node->commaToken(), node);
        nonterminal(node->typeName());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }